

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

StringPiece __thiscall
google::protobuf::stringpiece_internal::StringPiece::substr
          (StringPiece *this,size_type pos,size_type n)

{
  ulong uVar1;
  char *pcVar2;
  ulong size;
  size_type sVar3;
  StringPiece SVar4;
  
  uVar1 = this->length_;
  if (uVar1 < pos) {
    pos = uVar1;
  }
  size = uVar1 - pos;
  if (n <= uVar1 - pos) {
    size = n;
  }
  pcVar2 = this->ptr_;
  sVar3 = CheckSize(size);
  SVar4.length_ = sVar3;
  SVar4.ptr_ = pcVar2 + pos;
  return SVar4;
}

Assistant:

StringPiece StringPiece::substr(size_type pos, size_type n) const {
  if (pos > length()) pos = length();
  if (n > length_ - pos) n = length() - pos;
  return StringPiece(ptr_ + pos, n);
}